

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_HybridUUID.cpp
# Opt level: O1

string * calc_uuid_abi_cxx11_(string *__return_storage_ptr__,PlayerInfo *player)

{
  pointer pcVar1;
  undefined8 uVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  if (player->steamid == 0) {
    local_30.field_2._M_allocated_capacity._0_2_ = 0x4e;
    local_30._M_string_length = 1;
    local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
    pbVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             _M_append(&local_30,(player->name)._M_dataplus._M_p,(player->name)._M_string_length);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar1 = (pbVar3->_M_dataplus)._M_p;
    paVar4 = &pbVar3->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar1 == paVar4) {
      uVar2 = *(undefined8 *)((long)&pbVar3->field_2 + 8);
      (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar4->_M_allocated_capacity;
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar2;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = pcVar1;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar4->_M_allocated_capacity;
    }
    __return_storage_ptr__->_M_string_length = pbVar3->_M_string_length;
    (pbVar3->_M_dataplus)._M_p = (pointer)paVar4;
    pbVar3->_M_string_length = 0;
    (pbVar3->field_2)._M_local_buf[0] = '\0';
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p,
                      CONCAT62(local_30.field_2._M_allocated_capacity._2_6_,
                               local_30.field_2._M_allocated_capacity._0_2_) + 1);
    }
  }
  else {
    string_printf_abi_cxx11_(__return_storage_ptr__,"S%.16llX");
  }
  return __return_storage_ptr__;
}

Assistant:

std::string calc_uuid(RenX::PlayerInfo &player)
{
	if (player.steamid != 0U)
		return string_printf("S%.16llX", player.steamid);
	return "N"s + player.name;
}